

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O2

void __thiscall args::Base::~Base(Base *this)

{
  this->_vptr_Base = (_func_int **)&PTR__Base_0012c9b8;
  std::__cxx11::string::~string((string *)&this->help);
  return;
}

Assistant:

virtual ~Base() {}